

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::baz(TestInterfaceImpl *this,BazContext context)

{
  int iVar1;
  long *in_RDX;
  bool bVar2;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar3;
  Promise<void> PVar4;
  Reader params;
  StructReader in_stack_000003e0;
  undefined1 local_210 [8];
  Runnable local_208;
  CapTableReader *pCStack_200;
  WirePointer *local_1f8;
  ArrayDisposer *pAStack_1f0;
  StructReader local_1e8;
  StructReader local_1b8;
  Maybe<kj::Exception> local_188;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_208);
  local_188.ptr.field_1.value.ownFile.content.size_ = (size_t)local_1f8;
  local_188.ptr.field_1.value.ownFile.content.disposer = pAStack_1f0;
  local_188.ptr._0_8_ = local_208._vptr_Runnable;
  local_188.ptr.field_1.value.ownFile.content.ptr = (char *)pCStack_200;
  PointerReader::getStruct(&local_1e8,(PointerReader *)&local_188,(word *)0x0);
  bVar2 = local_1e8.pointerCount == 0;
  local_188.ptr.field_1.value.ownFile.content.size_ = (size_t)local_1e8.pointers;
  if (bVar2) {
    local_188.ptr.field_1.value.ownFile.content.size_ = (size_t)(WirePointer *)0x0;
  }
  iVar1 = 0x7fffffff;
  if (!bVar2) {
    iVar1 = local_1e8.nestingLimit;
  }
  local_188.ptr._0_4_ = 0;
  local_188.ptr._4_4_ = 0;
  local_188.ptr.field_1._0_4_ = 0;
  local_188.ptr.field_1._4_4_ = 0;
  if (!bVar2) {
    local_188.ptr._0_4_ = local_1e8.segment._0_4_;
    local_188.ptr._4_4_ = local_1e8.segment._4_4_;
    local_188.ptr.field_1._0_4_ = local_1e8.capTable._0_4_;
    local_188.ptr.field_1._4_4_ = local_1e8.capTable._4_4_;
  }
  local_188.ptr.field_1._16_4_ = iVar1;
  PointerReader::getStruct(&local_1b8,(PointerReader *)&local_188,(word *)0x0);
  anon_unknown_129::genericCheckTestMessage<capnproto_test::capnp::test::TestAllTypes::Reader>
            ((Reader)in_stack_000003e0);
  (**(code **)(*in_RDX + 8))();
  local_208._vptr_Runnable = (_func_int **)&PTR_run_0036f0f0;
  pCStack_200 = (CapTableReader *)local_210;
  kj::_::runCatchingExceptions(&local_188,&local_208);
  if ((Void)local_188.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_188.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[88]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x388,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr\""
               ,(char (*) [88])
                "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr"
              );
  }
  OVar3 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_188);
  PVar4.super_PromiseBase.node.ptr = OVar3.ptr;
  (this->super_Server)._vptr_Server = (_func_int **)local_188.ptr._0_8_;
  *(char **)&(this->super_Server).field_0x8 = local_188.ptr.field_1.value.ownFile.content.ptr;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::baz(BazContext context) {
  ++callCount;
  auto params = context.getParams();
  checkTestMessage(params.getS());
  context.releaseParams();
  EXPECT_ANY_THROW(context.getParams());

  return kj::READY_NOW;
}